

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

void __thiscall KDIS::KDataStream::ReadFromString(KDataStream *this,KString *S)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  uchar local_1a1;
  stringstream local_1a0 [7];
  KUINT8 o;
  KStringStream ss;
  KString *S_local;
  KDataStream *this_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)S,_Var2);
  while( true ) {
    piVar3 = (istream *)std::istream::operator>>((istream *)local_1a0,std::hex);
    piVar3 = std::operator>>(piVar3,&local_1a1);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vBuffer,&local_1a1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void KDataStream::ReadFromString( const KString & S )
{
    KStringStream ss( S );

    KUINT8 o;
    while( ss >> hex >> o )
    {
        m_vBuffer.push_back( o );
    }
}